

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O1

int aead_aes128gcm_setup_crypto(ptls_aead_context_t *ctx,int is_enc,void *key)

{
  aesgcm_context_t *ctx_1;
  
  ctx->dispose_crypto = aesgcm_dispose_crypto;
  if (is_enc == 0) {
    ctx->do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    ctx->do_encrypt_update = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0
    ;
    ctx->do_encrypt_final = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    ctx->do_decrypt = aesgcm_decrypt;
  }
  else {
    ctx->do_encrypt_init = aesgcm_encrypt_init;
    ctx->do_encrypt_update = aesgcm_encrypt_update;
    ctx->do_encrypt_final = aesgcm_encrypt_final;
    ctx->do_decrypt =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_void_ptr_void_ptr_size_t
          *)0x0;
  }
  cf_aes_init((cf_aes_context *)(ctx + 1),(uint8_t *)key,0x10);
  return 0;
}

Assistant:

static int aead_aes128gcm_setup_crypto(ptls_aead_context_t *ctx, int is_enc, const void *key)
{
    return aead_aesgcm_setup_crypto(ctx, is_enc, key, PTLS_AES128_KEY_SIZE);
}